

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

void avro::assertType(Entity *e,EntityType et)

{
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  EntityType et_local;
  EntityType local_fc;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  if (e->type_ == et) {
    return;
  }
  et_local = et;
  this = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"Unexpected type for default value: Expected %1%, but found %2%");
  pbVar1 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,avro::json::EntityType&>
                     (&local_f8,&et_local);
  local_fc = e->type_;
  pbVar1 = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,avro::json::EntityType_const&>
                     (pbVar1,&local_fc);
  Exception::Exception(this,pbVar1);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void assertType(const Entity& e, EntityType et)
{
    if (e.type() != et) {
        throw Exception(boost::format("Unexpected type for default value: "
            "Expected %1%, but found %2%") % et % e.type());
    }
}